

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QRingChunk>::eraseFirst(QGenericArrayOps<QRingChunk> *this)

{
  long in_RDI;
  
  QArrayDataPointer<QRingChunk>::begin((QArrayDataPointer<QRingChunk> *)0x168c0c);
  QRingChunk::~QRingChunk((QRingChunk *)0x168c14);
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 0x28;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
  return;
}

Assistant:

void eraseFirst() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        this->begin()->~T();
        ++this->ptr;
        --this->size;
    }